

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void __thiscall SHA256::update(SHA256 *this,uchar *message,uint len)

{
  uint block_nb_00;
  uint uVar1;
  uint local_44;
  uchar *shifted_message;
  uint tmp_len;
  uint rem_len;
  uint new_len;
  uint block_nb;
  uint len_local;
  uchar *message_local;
  SHA256 *this_local;
  
  local_44 = 0x40 - this->m_len;
  if (len < local_44) {
    local_44 = len;
  }
  memcpy(this->m_block + this->m_len,message,(ulong)local_44);
  if (this->m_len + len < 0x40) {
    this->m_len = len + this->m_len;
  }
  else {
    block_nb_00 = len - local_44 >> 6;
    transform(this,this->m_block,1);
    transform(this,message + local_44,block_nb_00);
    uVar1 = len - local_44 & 0x3f;
    memcpy(this->m_block,message + local_44 + (block_nb_00 << 6),(ulong)uVar1);
    this->m_len = uVar1;
    this->m_tot_len = (block_nb_00 + 1) * 0x40 + this->m_tot_len;
  }
  return;
}

Assistant:

void SHA256::update(const unsigned char *message, unsigned int len)
{
    unsigned int block_nb;
    unsigned int new_len, rem_len, tmp_len;
    const unsigned char *shifted_message;
    tmp_len = SHA224_256_BLOCK_SIZE - m_len;
    rem_len = len < tmp_len ? len : tmp_len;
    memcpy(&m_block[m_len], message, rem_len);
    if (m_len + len < SHA224_256_BLOCK_SIZE) {
        m_len += len;
        return;
    }
    new_len = len - rem_len;
    block_nb = new_len / SHA224_256_BLOCK_SIZE;
    shifted_message = message + rem_len;
    transform(m_block, 1);
    transform(shifted_message, block_nb);
    rem_len = new_len % SHA224_256_BLOCK_SIZE;
    memcpy(m_block, &shifted_message[block_nb << 6], rem_len);
    m_len = rem_len;
    m_tot_len += (block_nb + 1) << 6;
}